

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_block.cpp
# Opt level: O0

uint32_t __thiscall
cppnet::BufferBlock::Write(BufferBlock *this,shared_ptr<cppnet::InnerBuffer> *buffer,uint32_t len)

{
  int iVar1;
  int iVar2;
  element_type *peVar3;
  element_type *this_00;
  uint local_64;
  uint32_t write_done_size;
  uint32_t total_size;
  undefined1 local_50 [8];
  shared_ptr<cppnet::BufferBlock> block_buffer;
  uint32_t len2;
  uint32_t len1;
  void *data2;
  void *data1;
  shared_ptr<cppnet::InnerBuffer> *psStack_20;
  uint32_t len_local;
  shared_ptr<cppnet::InnerBuffer> *buffer_local;
  BufferBlock *this_local;
  
  data1._4_4_ = len;
  psStack_20 = buffer;
  buffer_local = (shared_ptr<cppnet::InnerBuffer> *)this;
  if (len == 0) {
    peVar3 = std::__shared_ptr_access<cppnet::InnerBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<cppnet::InnerBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)buffer);
    data1._4_4_ = (*(peVar3->super_Buffer)._vptr_Buffer[8])();
  }
  if (this->_buffer_start == (char *)0x0) {
    this_local._4_4_ = 0;
  }
  else {
    if (((this->_can_read & 1U) == 0) && (this->_read == this->_write)) {
      this->_read = this->_buffer_start;
      this->_write = this->_buffer_start;
    }
    data2 = (void *)0x0;
    _len2 = (void *)0x0;
    block_buffer.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi._4_4_ = 0;
    block_buffer.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi._0_4_ = 0;
    std::dynamic_pointer_cast<cppnet::BufferBlock,cppnet::InnerBuffer>
              ((shared_ptr<cppnet::InnerBuffer> *)local_50);
    this_00 = std::
              __shared_ptr_access<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_50);
    GetUseMemoryBlock(this_00,&data2,
                      (uint32_t *)
                      ((long)&block_buffer.
                              super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi + 4),(void **)&len2,
                      (uint32_t *)
                      &block_buffer.
                       super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount);
    if (data1._4_4_ <
        block_buffer.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi._4_4_ +
        (uint)block_buffer.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi) {
      if ((data1._4_4_ <
           block_buffer.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi._4_4_ +
           (uint)block_buffer.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi) &&
         (block_buffer.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi._4_4_ <= data1._4_4_)) {
        iVar1 = (*(this->super_InnerBuffer).super_Buffer._vptr_Buffer[10])
                          (this,data2,
                           (ulong)block_buffer.
                                  super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi._4_4_);
        iVar2 = (*(this->super_InnerBuffer).super_Buffer._vptr_Buffer[10])
                          (this,_len2,
                           (ulong)(data1._4_4_ -
                                  block_buffer.
                                  super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi._4_4_));
        local_64 = iVar2 + iVar1;
      }
      else {
        local_64 = (*(this->super_InnerBuffer).super_Buffer._vptr_Buffer[10])
                             (this,data2,(ulong)data1._4_4_);
      }
    }
    else {
      iVar1 = (*(this->super_InnerBuffer).super_Buffer._vptr_Buffer[10])
                        (this,data2,
                         (ulong)block_buffer.
                                super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi._4_4_);
      iVar2 = (*(this->super_InnerBuffer).super_Buffer._vptr_Buffer[10])
                        (this,_len2,
                         (ulong)(uint)block_buffer.
                                      super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount._M_pi);
      local_64 = iVar2 + iVar1;
    }
    peVar3 = std::__shared_ptr_access<cppnet::InnerBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<cppnet::InnerBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)buffer);
    (*(peVar3->super_Buffer)._vptr_Buffer[6])(peVar3,(ulong)local_64);
    this_local._4_4_ = local_64;
    std::shared_ptr<cppnet::BufferBlock>::~shared_ptr((shared_ptr<cppnet::BufferBlock> *)local_50);
  }
  return this_local._4_4_;
}

Assistant:

uint32_t BufferBlock::Write(std::shared_ptr<InnerBuffer> buffer, uint32_t len) {
    if (len == 0) {
        len = buffer->GetCanReadLength();
    }

    if (!_buffer_start) {
        return 0;
    }

    if(!_can_read && _read == _write) {
        _write = _read = _buffer_start;
    }

    void* data1 = nullptr, *data2 = nullptr;
    uint32_t len1 = 0, len2 = 0;

    std::shared_ptr<BufferBlock> block_buffer = std::dynamic_pointer_cast<BufferBlock>(buffer);
    block_buffer->GetUseMemoryBlock(data1, len1, data2, len2);
    uint32_t total_size = len1 + len2;
    uint32_t write_done_size = 0;
    
    // write all data
    if (len >= total_size) {
        write_done_size += Write((char*)data1, len1);
        write_done_size += Write((char*)data2, len2);

    // write part of data
    } else if (len < total_size && len >= len1) {
        write_done_size += Write((char*)data1, len1);
        write_done_size += Write((char*)data2, len - len1);

    // write part of data
    } else {
        write_done_size += Write((char*)data1, len);
    }

    buffer->MoveReadPt(write_done_size);
    return write_done_size;
}